

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

Zyx_Man_t * Zyx_ManAlloc(Bmc_EsPar_t *pPars,word *pTruth)

{
  byte bVar1;
  int iVar2;
  Bmc_EsPar_t *pBVar3;
  byte bVar4;
  int iVar5;
  Zyx_Man_t *p;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Wrd_t *pVVar8;
  bmcg_sat_solver *s;
  void *__s;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  
  p = (Zyx_Man_t *)calloc(1,0x2278);
  p->pPars = pPars;
  p->pTruth = pTruth;
  iVar2 = pPars->nVars;
  iVar9 = pPars->nNodes;
  iVar11 = iVar9 + iVar2;
  bVar4 = (byte)iVar2;
  iVar5 = 1 << (bVar4 - 6 & 0x1f);
  if (iVar2 < 7) {
    iVar5 = 1;
  }
  p->nObjs = iVar11;
  p->nWords = iVar5;
  bVar1 = (byte)pPars->nLutSize;
  p->LutMask = ~(-1 << (bVar1 & 0x1f));
  iVar5 = iVar9 << (bVar1 & 0x1f);
  p->TopoBase = iVar5;
  iVar5 = iVar5 + iVar11 * iVar9;
  p->MintBase = iVar5;
  iVar11 = iVar11 << (bVar4 & 0x1f);
  iVar2 = iVar5 + iVar11;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < (uint)(iVar11 + -1 + iVar5)) {
    iVar9 = iVar2;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar6->pArray = piVar7;
  pVVar6->nSize = iVar2;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,(long)iVar2 << 2);
  }
  p->vVarValues = pVVar6;
  uVar12 = 1 << (bVar4 & 0x1f);
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar10 = 0x10;
  if (0x10 < uVar12) {
    uVar10 = uVar12;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar10;
  piVar7 = (int *)malloc((long)(int)uVar10 << 2);
  pVVar6->pArray = piVar7;
  p->vMidMints = pVVar6;
  pVVar8 = Zyx_ManTruthTables(p,pTruth);
  p->vInfo = pVVar8;
  pBVar3 = p->pPars;
  if (pBVar3->fMajority != 0) {
    uVar10 = p->nWords * p->nObjs;
    if (((int)uVar10 < 0) || (pVVar8->nSize <= (int)uVar10)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    pTruth = pVVar8->pArray + uVar10;
  }
  pVVar6 = Zyx_ManCreateSymVarPairs(pTruth,pBVar3->nVars);
  p->vPairs = pVVar6;
  s = bmcg_sat_solver_start();
  p->pSat = s;
  if (pPars->fUseIncr != 0) {
    if ((pBVar3->nLutSize == 2) || (pBVar3->fMajority != 0)) {
      uVar10 = p->nObjs * p->nObjs * (pBVar3->nNodes << ((byte)pBVar3->nVars & 0x1f));
      iVar11 = (((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
      piVar7 = (int *)malloc(0x10);
      piVar7[1] = 0;
      *piVar7 = iVar11 * 0x20;
      if (iVar11 == 0) {
        __s = (void *)0x0;
      }
      else {
        __s = malloc((long)iVar11 << 2);
      }
      *(void **)(piVar7 + 2) = __s;
      piVar7[1] = iVar11 * 0x20;
      lVar13 = 0x40;
    }
    else {
      if (pBVar3->nLutSize != 3) goto LAB_005a5bb6;
      iVar11 = p->nObjs;
      uVar10 = iVar11 * iVar11 * iVar11 * (pBVar3->nNodes << ((byte)pBVar3->nVars & 0x1f));
      iVar11 = (((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
      piVar7 = (int *)malloc(0x10);
      piVar7[1] = 0;
      *piVar7 = iVar11 * 0x20;
      if (iVar11 == 0) {
        __s = (void *)0x0;
      }
      else {
        __s = malloc((long)iVar11 << 2);
      }
      *(void **)(piVar7 + 2) = __s;
      piVar7[1] = iVar11 * 0x20;
      lVar13 = 0x48;
    }
    memset(__s,0,(long)iVar11 << 2);
    *(int **)((long)p->nUsed + lVar13 + -0x58) = piVar7;
  }
LAB_005a5bb6:
  bmcg_sat_solver_set_nvars(s,(p->nObjs << ((byte)pBVar3->nVars & 0x1f)) + p->MintBase);
  Zyx_ManSetupVars(p);
  Zyx_ManAddCnfStart(p);
  Zyx_ManPrintVarMap(p,0);
  return p;
}

Assistant:

Zyx_Man_t * Zyx_ManAlloc( Bmc_EsPar_t * pPars, word * pTruth )
{
    Zyx_Man_t * p = ABC_CALLOC( Zyx_Man_t, 1 );
    p->pPars      = pPars;
    p->pTruth     = pTruth;
    p->nObjs      = p->pPars->nVars + p->pPars->nNodes;
    p->nWords     = Abc_TtWordNum(p->pPars->nVars);
    p->LutMask    = (1 << p->pPars->nLutSize) - 1;
    p->TopoBase   = (1 << p->pPars->nLutSize) * p->pPars->nNodes;
    p->MintBase   = p->TopoBase + p->pPars->nNodes * p->nObjs;
    p->vVarValues = Vec_IntStartFull( p->MintBase + (1 << p->pPars->nVars) * p->nObjs );
    p->vMidMints  = Vec_IntAlloc( 1 << p->pPars->nVars );
    p->vInfo      = Zyx_ManTruthTables( p, pTruth );
    p->vPairs     = Zyx_ManCreateSymVarPairs( p->pPars->fMajority ? Zyx_ManTruth(p, p->nObjs) : pTruth, p->pPars->nVars );
    p->pSat       = bmcg_sat_solver_start();
    if ( pPars->fUseIncr )
    {
        if ( p->pPars->nLutSize == 2 || p->pPars->fMajority )
            p->vUsed2     = Vec_BitStart( (1 << p->pPars->nVars) * p->pPars->nNodes * p->nObjs * p->nObjs );
        else if ( p->pPars->nLutSize == 3 )
            p->vUsed3     = Vec_BitStart( (1 << p->pPars->nVars) * p->pPars->nNodes * p->nObjs * p->nObjs * p->nObjs );
    }
    bmcg_sat_solver_set_nvars( p->pSat, p->MintBase + (1 << p->pPars->nVars) * p->nObjs );
    Zyx_ManSetupVars( p );
    Zyx_ManAddCnfStart( p );
    Zyx_ManPrintVarMap( p, 0 );
    return p;
}